

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeLiteGenerator::CreateProjectSourceEntries
          (cmExtraCodeLiteGenerator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          *cFiles,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *otherFiles,cmXMLWriter *_xml,string *projectPath,cmMakefile *mf,
          string *projectType,string *targetName)

{
  uint uVar1;
  uint uVar2;
  string *psVar3;
  char *this_00;
  cmExtraCodeLiteGenerator *pcVar4;
  string outputPath;
  string relapath;
  SystemInformation info;
  string codeliteCompilerName;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  SystemInformation local_58;
  string local_50;
  
  FindMatchingHeaderfiles(this,cFiles,otherFiles);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"VirtualDirectory",(allocator<char> *)&local_b8);
  cmXMLWriter::StartElement(_xml,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar4 = (cmExtraCodeLiteGenerator *)_xml;
  cmXMLWriter::Attribute<char[4]>(_xml,"Name",(char (*) [4])0x642674);
  CreateFoldersAndFiles(pcVar4,cFiles,_xml,projectPath);
  cmXMLWriter::EndElement(_xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"VirtualDirectory",(allocator<char> *)&local_b8);
  cmXMLWriter::StartElement(_xml,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar4 = (cmExtraCodeLiteGenerator *)_xml;
  cmXMLWriter::Attribute<char[8]>(_xml,"Name",(char (*) [8])0x6445bd);
  CreateFoldersAndFiles(pcVar4,otherFiles,_xml,projectPath);
  cmXMLWriter::EndElement(_xml);
  cmsys::SystemInformation::SystemInformation(&local_58);
  cmsys::SystemInformation::RunCPUCheck(&local_58);
  uVar1 = cmsys::SystemInformation::GetNumberOfLogicalCPU(&local_58);
  uVar2 = cmsys::SystemInformation::GetNumberOfPhysicalCPU(&local_58);
  this->CpuCount = uVar2 * uVar1;
  GetCodeLiteCompilerName_abi_cxx11_(&local_50,this,mf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Settings",(allocator<char> *)&local_78);
  cmXMLWriter::StartElement(_xml,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"Type",projectType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Configuration",(allocator<char> *)&local_78);
  cmXMLWriter::StartElement(_xml,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"Name",&this->ConfigName);
  GetCodeLiteCompilerName_abi_cxx11_(&local_b8,this,mf);
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"CompilerType",&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  cmXMLWriter::Attribute<char[17]>(_xml,"DebuggerType",(char (*) [17])"GNU gdb debugger");
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"Type",projectType);
  cmXMLWriter::Attribute<char[7]>(_xml,"BuildCmpWithGlobalSettings",(char (*) [7])0x625445);
  cmXMLWriter::Attribute<char[7]>(_xml,"BuildLnkWithGlobalSettings",(char (*) [7])0x625445);
  cmXMLWriter::Attribute<char[7]>(_xml,"BuildResWithGlobalSettings",(char (*) [7])0x625445);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Compiler",(allocator<char> *)&local_78);
  cmXMLWriter::StartElement(_xml,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  cmXMLWriter::Attribute<char[3]>(_xml,"Options",(char (*) [3])"-g");
  cmXMLWriter::Attribute<char[4]>(_xml,"Required",(char (*) [4])0x60394e);
  cmXMLWriter::Attribute<char[1]>(_xml,"PreCompiledHeader",(char (*) [1])0x6805f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"IncludePath",(allocator<char> *)&local_78);
  cmXMLWriter::StartElement(_xml,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  cmXMLWriter::Attribute<char[2]>(_xml,"Value",(char (*) [2])0x617404);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"Linker",(allocator<char> *)&local_78);
  cmXMLWriter::StartElement(_xml,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x6805f9);
  cmXMLWriter::Attribute<char[4]>(_xml,"Required",(char (*) [4])0x60394e);
  cmXMLWriter::EndElement(_xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"ResourceCompiler",(allocator<char> *)&local_78);
  cmXMLWriter::StartElement(_xml,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x6805f9);
  cmXMLWriter::Attribute<char[3]>(_xml,"Required",(char (*) [3])0x67f76a);
  cmXMLWriter::EndElement(_xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"General",(allocator<char> *)&local_78);
  cmXMLWriter::StartElement(_xml,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CMAKE_RUNTIME_OUTPUT_DIRECTORY",(allocator<char> *)&local_d8);
  psVar3 = cmMakefile::GetSafeDefinition(mf,&local_78);
  std::__cxx11::string::string((string *)&local_b8,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_78);
  if (local_b8._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"EXECUTABLE_OUTPUT_PATH",(allocator<char> *)&local_d8);
    cmMakefile::GetSafeDefinition(mf,&local_78);
    std::__cxx11::string::_M_assign((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    local_78._M_string_length = 0;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78.field_2._M_local_buf[0] = '\0';
    if (local_b8._M_string_length == 0) {
      cmXMLWriter::Attribute<char[40]>
                (_xml,"OutputFile",(char (*) [40])"$(IntermediateDirectory)/$(ProjectName)");
      goto LAB_003a33a5;
    }
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_string_length = 0;
  cmSystemTools::RelativePath(&local_d8,projectPath,&local_b8);
  std::__cxx11::string::operator=((string *)&local_78,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::operator+(&local_d8,&local_78,"/$(ProjectName)");
  cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"OutputFile",&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
LAB_003a33a5:
  cmXMLWriter::Attribute<char[3]>(_xml,"IntermediateDirectory",(char (*) [3])0x5ffd3e);
  cmXMLWriter::Attribute<char[17]>(_xml,"Command",(char (*) [17])"./$(ProjectName)");
  cmXMLWriter::Attribute<char[1]>(_xml,"CommandArguments",(char (*) [1])0x6805f9);
  if (local_b8._M_string_length == 0) {
    cmXMLWriter::Attribute<char[25]>
              (_xml,"WorkingDirectory",(char (*) [25])"$(IntermediateDirectory)");
  }
  else {
    cmXMLWriter::Attribute<std::__cxx11::string>(_xml,"WorkingDirectory",&local_78);
  }
  cmXMLWriter::Attribute<char[4]>(_xml,"PauseExecWhenProcTerminates",(char (*) [4])0x60394e);
  cmXMLWriter::EndElement(_xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Debugger",(allocator<char> *)&local_98);
  cmXMLWriter::StartElement(_xml,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  cmXMLWriter::Attribute<char[3]>(_xml,"IsRemote",(char (*) [3])0x67f76a);
  cmXMLWriter::Attribute<char[1]>(_xml,"RemoteHostName",(char (*) [1])0x6805f9);
  cmXMLWriter::Attribute<char[1]>(_xml,"RemoteHostPort",(char (*) [1])0x6805f9);
  cmXMLWriter::Attribute<char[1]>(_xml,"DebuggerPath",(char (*) [1])0x6805f9);
  cmXMLWriter::Element(_xml,"PostConnectCommands");
  cmXMLWriter::Element(_xml,"StartupCommands");
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::Element(_xml,"PreBuild");
  cmXMLWriter::Element(_xml,"PostBuild");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"CustomBuild",(allocator<char> *)&local_98);
  cmXMLWriter::StartElement(_xml,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  cmXMLWriter::Attribute<char[4]>(_xml,"Enabled",(char (*) [4])0x60394e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"RebuildCommand",&local_d9)
  ;
  GetRebuildCommand(&local_98,this,mf,targetName);
  cmXMLWriter::Element<std::__cxx11::string>(_xml,&local_d8,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"CleanCommand",&local_d9);
  GetCleanCommand(&local_98,this,mf,targetName);
  cmXMLWriter::Element<std::__cxx11::string>(_xml,&local_d8,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"BuildCommand",&local_d9);
  GetBuildCommand(&local_98,this,mf,targetName);
  cmXMLWriter::Element<std::__cxx11::string>(_xml,&local_d8,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  this_00 = "SingleFileCommand";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"SingleFileCommand",&local_d9);
  GetSingleFileBuildCommand_abi_cxx11_(&local_98,(cmExtraCodeLiteGenerator *)this_00,mf);
  cmXMLWriter::Element<std::__cxx11::string>(_xml,&local_d8,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  cmXMLWriter::Element(_xml,"PreprocessFileCommand");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"WorkingDirectory",(allocator<char> *)&local_98);
  cmXMLWriter::Element<char[17]>(_xml,&local_d8,(char (*) [17])"$(WorkspacePath)");
  std::__cxx11::string::~string((string *)&local_d8);
  cmXMLWriter::EndElement(_xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"AdditionalRules",(allocator<char> *)&local_98);
  cmXMLWriter::StartElement(_xml,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  cmXMLWriter::Element(_xml,"CustomPostBuild");
  cmXMLWriter::Element(_xml,"CustomPreBuild");
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"GlobalSettings",(allocator<char> *)&local_98);
  cmXMLWriter::StartElement(_xml,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Compiler",(allocator<char> *)&local_98);
  cmXMLWriter::StartElement(_xml,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x6805f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"IncludePath",(allocator<char> *)&local_98);
  cmXMLWriter::StartElement(_xml,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  cmXMLWriter::Attribute<char[2]>(_xml,"Value",(char (*) [2])0x617404);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Linker",(allocator<char> *)&local_98);
  cmXMLWriter::StartElement(_xml,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x6805f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"LibraryPath",(allocator<char> *)&local_98);
  cmXMLWriter::StartElement(_xml,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  cmXMLWriter::Attribute<char[2]>(_xml,"Value",(char (*) [2])0x617404);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"ResourceCompiler",(allocator<char> *)&local_98);
  cmXMLWriter::StartElement(_xml,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  cmXMLWriter::Attribute<char[1]>(_xml,"Options",(char (*) [1])0x6805f9);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  cmXMLWriter::EndElement(_xml);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_50);
  cmsys::SystemInformation::~SystemInformation(&local_58);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateProjectSourceEntries(
  std::map<std::string, cmSourceFile*>& cFiles,
  std::set<std::string>& otherFiles, cmXMLWriter* _xml,
  const std::string& projectPath, const cmMakefile* mf,
  const std::string& projectType, const std::string& targetName)
{
  cmXMLWriter& xml(*_xml);
  this->FindMatchingHeaderfiles(cFiles, otherFiles);
  // Create 2 virtual folders: src and include
  // and place all the implementation files into the src
  // folder, the rest goes to the include folder
  xml.StartElement("VirtualDirectory");
  xml.Attribute("Name", "src");

  // insert all source files in the codelite project
  // first the C/C++ implementation files, then all others
  this->CreateFoldersAndFiles(cFiles, xml, projectPath);
  xml.EndElement(); // VirtualDirectory

  xml.StartElement("VirtualDirectory");
  xml.Attribute("Name", "include");
  this->CreateFoldersAndFiles(otherFiles, xml, projectPath);
  xml.EndElement(); // VirtualDirectory

  // Get the number of CPUs. We use this information for the make -jN
  // command
  cmsys::SystemInformation info;
  info.RunCPUCheck();

  this->CpuCount =
    info.GetNumberOfLogicalCPU() * info.GetNumberOfPhysicalCPU();

  std::string codeliteCompilerName = this->GetCodeLiteCompilerName(mf);

  xml.StartElement("Settings");
  xml.Attribute("Type", projectType);

  xml.StartElement("Configuration");
  xml.Attribute("Name", this->ConfigName);
  xml.Attribute("CompilerType", this->GetCodeLiteCompilerName(mf));
  xml.Attribute("DebuggerType", "GNU gdb debugger");
  xml.Attribute("Type", projectType);
  xml.Attribute("BuildCmpWithGlobalSettings", "append");
  xml.Attribute("BuildLnkWithGlobalSettings", "append");
  xml.Attribute("BuildResWithGlobalSettings", "append");

  xml.StartElement("Compiler");
  xml.Attribute("Options", "-g");
  xml.Attribute("Required", "yes");
  xml.Attribute("PreCompiledHeader", "");
  xml.StartElement("IncludePath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // IncludePath
  xml.EndElement(); // Compiler

  xml.StartElement("Linker");
  xml.Attribute("Options", "");
  xml.Attribute("Required", "yes");
  xml.EndElement(); // Linker

  xml.StartElement("ResourceCompiler");
  xml.Attribute("Options", "");
  xml.Attribute("Required", "no");
  xml.EndElement(); // ResourceCompiler

  xml.StartElement("General");
  std::string outputPath =
    mf->GetSafeDefinition("CMAKE_RUNTIME_OUTPUT_DIRECTORY");
  if (outputPath.empty()) {
    outputPath = mf->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  }
  std::string relapath;
  if (!outputPath.empty()) {
    relapath = cmSystemTools::RelativePath(projectPath, outputPath);
    xml.Attribute("OutputFile", relapath + "/$(ProjectName)");
  } else {
    xml.Attribute("OutputFile", "$(IntermediateDirectory)/$(ProjectName)");
  }
  xml.Attribute("IntermediateDirectory", "./");
  xml.Attribute("Command", "./$(ProjectName)");
  xml.Attribute("CommandArguments", "");
  if (!outputPath.empty()) {
    xml.Attribute("WorkingDirectory", relapath);
  } else {
    xml.Attribute("WorkingDirectory", "$(IntermediateDirectory)");
  }
  xml.Attribute("PauseExecWhenProcTerminates", "yes");
  xml.EndElement(); // General

  xml.StartElement("Debugger");
  xml.Attribute("IsRemote", "no");
  xml.Attribute("RemoteHostName", "");
  xml.Attribute("RemoteHostPort", "");
  xml.Attribute("DebuggerPath", "");
  xml.Element("PostConnectCommands");
  xml.Element("StartupCommands");
  xml.EndElement(); // Debugger

  xml.Element("PreBuild");
  xml.Element("PostBuild");

  xml.StartElement("CustomBuild");
  xml.Attribute("Enabled", "yes");
  xml.Element("RebuildCommand", this->GetRebuildCommand(mf, targetName));
  xml.Element("CleanCommand", this->GetCleanCommand(mf, targetName));
  xml.Element("BuildCommand", this->GetBuildCommand(mf, targetName));
  xml.Element("SingleFileCommand", this->GetSingleFileBuildCommand(mf));
  xml.Element("PreprocessFileCommand");
  xml.Element("WorkingDirectory", "$(WorkspacePath)");
  xml.EndElement(); // CustomBuild

  xml.StartElement("AdditionalRules");
  xml.Element("CustomPostBuild");
  xml.Element("CustomPreBuild");
  xml.EndElement(); // AdditionalRules

  xml.EndElement(); // Configuration
  xml.StartElement("GlobalSettings");

  xml.StartElement("Compiler");
  xml.Attribute("Options", "");
  xml.StartElement("IncludePath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // IncludePath
  xml.EndElement(); // Compiler

  xml.StartElement("Linker");
  xml.Attribute("Options", "");
  xml.StartElement("LibraryPath");
  xml.Attribute("Value", ".");
  xml.EndElement(); // LibraryPath
  xml.EndElement(); // Linker

  xml.StartElement("ResourceCompiler");
  xml.Attribute("Options", "");
  xml.EndElement(); // ResourceCompiler

  xml.EndElement(); // GlobalSettings
  xml.EndElement(); // Settings
}